

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::registerReporterImpl
               (char *name,int priority,reporterCreatorFunc c,bool isReporter)

{
  reporterMap *prVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>,_bool>
  pVar2;
  pair<int,_doctest::String> local_d8;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  local_b8;
  _Base_ptr local_90;
  undefined1 local_88;
  pair<int,_doctest::String> local_70;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  local_50;
  undefined1 local_21;
  reporterCreatorFunc p_Stack_20;
  bool isReporter_local;
  reporterCreatorFunc c_local;
  char *pcStack_10;
  int priority_local;
  char *name_local;
  
  local_21 = isReporter;
  p_Stack_20 = c;
  c_local._4_4_ = priority;
  pcStack_10 = name;
  if (isReporter) {
    prVar1 = anon_unknown_14::getReporters();
    std::pair<int,_doctest::String>::pair<int_&,_const_char_*&,_true>
              (&local_70,(int *)((long)&c_local + 4),&stack0xfffffffffffffff0);
    std::
    pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
    ::
    pair<std::pair<int,_doctest::String>,_doctest::IReporter_*(*&)(const_doctest::ContextOptions_&),_true>
              (&local_50,&local_70,&stack0xffffffffffffffe0);
    pVar2 = std::
            map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
            ::insert(prVar1,&local_50);
    local_90 = (_Base_ptr)pVar2.first._M_node;
    local_88 = pVar2.second;
    std::
    pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
    ::~pair(&local_50);
    std::pair<int,_doctest::String>::~pair(&local_70);
  }
  else {
    prVar1 = anon_unknown_14::getListeners();
    std::pair<int,_doctest::String>::pair<int_&,_const_char_*&,_true>
              (&local_d8,(int *)((long)&c_local + 4),&stack0xfffffffffffffff0);
    std::
    pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
    ::
    pair<std::pair<int,_doctest::String>,_doctest::IReporter_*(*&)(const_doctest::ContextOptions_&),_true>
              (&local_b8,&local_d8,&stack0xffffffffffffffe0);
    std::
    map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
    ::insert(prVar1,&local_b8);
    std::
    pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
    ::~pair(&local_b8);
    std::pair<int,_doctest::String>::~pair(&local_d8);
  }
  return;
}

Assistant:

void registerReporterImpl(const char* name, int priority, reporterCreatorFunc c, bool isReporter) {
        if(isReporter)
            getReporters().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
        else
            getListeners().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
    }